

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O0

void duckdb::StringDetection(string *str_1,string *str_2,string *name_str_1,string *name_str_2)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  string *in_RSI;
  ulong in_RDI;
  string local_98 [32];
  string local_78 [55];
  allocator local_41;
  string local_40 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  uVar1 = ::std::__cxx11::string::empty();
  if ((((uVar1 & 1) == 0) && (uVar1 = ::std::__cxx11::string::empty(), (uVar1 & 1) == 0)) &&
     (lVar2 = ::std::__cxx11::string::find(in_RSI,in_RDI), lVar2 != -1)) {
    uVar3 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,"%s must not appear in the %s specification and vice versa",&local_41);
    ::std::__cxx11::string::string(local_78,(string *)in_RDX);
    ::std::__cxx11::string::string(local_98,(string *)in_RCX);
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              ((BinderException *)in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar3,&BinderException::typeinfo,BinderException::~BinderException);
  }
  return;
}

Assistant:

void StringDetection(const string &str_1, const string &str_2, const string &name_str_1, const string &name_str_2) {
	if (str_1.empty() || str_2.empty()) {
		return;
	}
	if (str_2.find(str_1) != string::npos) {
		throw BinderException("%s must not appear in the %s specification and vice versa", name_str_1, name_str_2);
	}
}